

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomNodeListPrivate::forEachNode
          (QDomNodeListPrivate *this,function_ref<void_(QDomNodePrivate_*)> yield)

{
  long lVar1;
  QDomNodePrivate *args;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *current;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar2;
  QDomNodeListPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&in_RDI->ref != 0) {
    args = findNextInOrder(in_stack_ffffffffffffffd8,in_RDI);
    while( true ) {
      bVar2 = false;
      if (args != (QDomNodePrivate *)0x0) {
        bVar2 = args != *(QDomNodePrivate **)&in_RDI->ref;
      }
      if (bVar2 == false) break;
      qxp::detail::function_ref_base<false,_void,_void,_QDomNodePrivate_*>::operator()
                ((function_ref_base<false,_void,_void,_QDomNodePrivate_*> *)
                 CONCAT17(bVar2,in_stack_ffffffffffffffc8),args);
      args = findNextInOrder((QDomNodeListPrivate *)args,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomNodeListPrivate::forEachNode(qxp::function_ref<void(QDomNodePrivate*)> yield) const
{
    if (!node_impl)
        return;

    QDomNodePrivate *current = findNextInOrder(node_impl);
    while (current && current != node_impl) {
        yield(current);
        current = findNextInOrder(current);
    }
}